

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O1

void __thiscall
Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::deleteContents
          (PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*> *this)

{
  long *plVar1;
  Entry *pEVar2;
  PtexCachedReader *pPVar3;
  void *pvVar4;
  pointer ppEVar5;
  pointer ppEVar6;
  long lVar7;
  ulong uVar8;
  
  if (this->_numEntries != 0) {
    lVar7 = 0x18;
    uVar8 = 0;
    do {
      if ((*(long *)((long)&(this->_entries->key)._val + lVar7) != 0) &&
         (plVar1 = *(long **)((long)&(this->_entries->key)._val + lVar7), plVar1 != (long *)0x0)) {
        (**(code **)(*plVar1 + 8))();
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x20;
    } while (uVar8 < this->_numEntries);
  }
  pEVar2 = this->_entries;
  if (pEVar2 != (Entry *)0x0) {
    pPVar3 = pEVar2[-1].value;
    if (pPVar3 != (PtexCachedReader *)0x0) {
      lVar7 = (long)pPVar3 << 5;
      do {
        if ((*(char *)((long)pEVar2 + lVar7 + -0x10) == '\x01') &&
           (pvVar4 = *(void **)((long)&pEVar2[-1].key._val + lVar7), pvVar4 != (void *)0x0)) {
          operator_delete__(pvVar4);
        }
        lVar7 = lVar7 + -0x20;
      } while (lVar7 != 0);
    }
    operator_delete__(&pEVar2[-1].value,(long)pPVar3 << 5 | 8);
  }
  ppEVar6 = (this->_oldEntries).
            super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_oldEntries).
      super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar6) {
    uVar8 = 0;
    do {
      pEVar2 = ppEVar6[uVar8];
      if (pEVar2 != (Entry *)0x0) {
        pPVar3 = pEVar2[-1].value;
        if (pPVar3 != (PtexCachedReader *)0x0) {
          lVar7 = (long)pPVar3 << 5;
          do {
            if ((*(char *)((long)pEVar2 + lVar7 + -0x10) == '\x01') &&
               (pvVar4 = *(void **)((long)&pEVar2[-1].key._val + lVar7), pvVar4 != (void *)0x0)) {
              operator_delete__(pvVar4);
            }
            lVar7 = lVar7 + -0x20;
          } while (lVar7 != 0);
        }
        operator_delete__(&pEVar2[-1].value,(long)pPVar3 << 5 | 8);
      }
      uVar8 = uVar8 + 1;
      ppEVar6 = (this->_oldEntries).
                super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->_oldEntries).
                                   super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar6 >> 3))
    ;
  }
  ppEVar5 = (this->_oldEntries).
            super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_oldEntries).
  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_oldEntries).
  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_oldEntries).
  super__Vector_base<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppEVar6 != (pointer)0x0) {
    operator_delete(ppEVar6,(long)ppEVar5 - (long)ppEVar6);
    return;
  }
  return;
}

Assistant:

void deleteContents()
    {
        for (uint32_t i = 0; i < _numEntries; ++i) {
            if (_entries[i].value) delete _entries[i].value;
        }
        delete [] _entries;
        for (size_t i = 0; i < _oldEntries.size(); ++i) {
            delete [] _oldEntries[i];
        }
        std::vector<Entry*>().swap(_oldEntries);
    }